

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::Exception::Detail>::setCapacity(Vector<kj::Exception::Detail> *this,size_t newSize)

{
  Detail *pDVar1;
  RemoveConst<kj::Exception::Detail> *pRVar2;
  Detail *pDVar3;
  __off_t in_RDX;
  ArrayBuilder<kj::Exception::Detail> local_38;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<kj::Exception::Detail>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Detail *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x20,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pDVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pDVar3 = (this->builder).ptr; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
    (local_38.pos)->id = pDVar3->id;
    ((local_38.pos)->value).ptr = (pDVar3->value).ptr;
    ((local_38.pos)->value).size_ = (pDVar3->value).size_;
    ((local_38.pos)->value).disposer = (pDVar3->value).disposer;
    local_38.pos = local_38.pos + 1;
    (pDVar3->value).ptr = (uchar *)0x0;
    (pDVar3->value).size_ = 0;
  }
  ArrayBuilder<kj::Exception::Detail>::operator=(&this->builder,&local_38);
  pDVar1 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pDVar3 = local_38.ptr;
  if (local_38.ptr != (Detail *)0x0) {
    local_38.ptr = (Detail *)0x0;
    local_38.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_38.endPtr = (Detail *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pDVar3,0x20,(long)pRVar2 - (long)pDVar3 >> 5,
               (long)pDVar1 - (long)pDVar3 >> 5,
               ArrayDisposer::Dispose_<kj::Exception::Detail>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }